

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.h
# Opt level: O2

HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
* __thiscall
TinyGC::
MakeGarbageCollected<HeapMap<LinkedNode,LinkedNode,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>
          (TinyGC *this)

{
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *this_00;
  ostream *poVar1;
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *local_30;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lck;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->alloc_mxt_);
  CheckThreshold(this);
  this_00 = (HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
             *)calloc(1,0x48);
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  ::HeapMap(this_00);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Object is allocated at ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_30 = this_00;
  std::__detail::
  _Insert<GarbageCollectedBase_*,_GarbageCollectedBase_*,_std::allocator<GarbageCollectedBase_*>,_std::__detail::_Identity,_std::equal_to<GarbageCollectedBase_*>,_std::hash<GarbageCollectedBase_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert((_Insert<GarbageCollectedBase_*,_GarbageCollectedBase_*,_std::allocator<GarbageCollectedBase_*>,_std::__detail::_Identity,_std::equal_to<GarbageCollectedBase_*>,_std::hash<GarbageCollectedBase_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            *)this,(value_type *)&local_30);
  this->bytes_allocated_ =
       this->bytes_allocated_ +
       (this_00->
       super_GarbageCollected<HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
       ).super_GarbageCollectedBase.obj_size_;
  this->size_of_objects_ = this->size_of_objects_ + 1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return this_00;
}

Assistant:

T *TinyGC::MakeGarbageCollected(Args &&...args) {
  std::unique_lock<std::mutex> lck(alloc_mxt_);
  CheckThreshold();
  T *new_obj = ::new (malloc(sizeof(T))) T(std::forward<Args>(args)...);
  LOG("Object is allocated at " << new_obj);
  objs_addr_.insert(new_obj);
  this->bytes_allocated_ += new_obj->GetObjSize();
  this->size_of_objects_++;
  return new_obj;
}